

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  basic_format_specs<wchar_t> *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  format_specs local_d8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [2];
  wchar_t awStack_90 [2];
  wchar_t local_88;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  local_78;
  
  pbVar2 = this->specs;
  if ((char)pbVar2->field_0x9 < '\0') {
    uVar7 = this->prefix_size;
    this->prefix_size = uVar7 + 1;
    this->prefix[uVar7] = '0';
    cVar1 = pbVar2->type;
    uVar7 = this->prefix_size;
    this->prefix_size = uVar7 + 1;
    this->prefix[uVar7] = cVar1;
  }
  local_78.f.abs_value._0_8_ = (ulong)this->abs_value;
  local_78.f.abs_value._8_8_ = *(ulong *)((long)&this->abs_value + 8);
  lVar5 = 0;
  uVar6 = local_78.f.abs_value._8_8_;
  uVar8 = (ulong)local_78.f.abs_value;
  do {
    uVar3 = uVar6 << 0x3f;
    lVar5 = lVar5 + 1;
    bVar9 = 1 < uVar8;
    bVar10 = uVar6 != 0;
    uVar4 = -uVar6;
    uVar6 = uVar6 >> 1;
    uVar8 = uVar3 | uVar8 >> 1;
  } while (bVar10 || uVar4 < bVar9);
  local_78.prefix.size_ = (size_t)this->prefix_size;
  local_d8.fill.data_[5] = (pbVar2->fill).data_[5];
  local_d8.width = pbVar2->width;
  local_d8.precision = pbVar2->precision;
  uStack_a0._0_1_ = pbVar2->type;
  uStack_a0._1_3_ = *(undefined3 *)&pbVar2->field_0x9;
  uStack_a0._4_4_ = (pbVar2->fill).data_[0];
  local_d8.fill.data_._4_8_ = *(undefined8 *)((pbVar2->fill).data_ + 1);
  local_d8.fill.data_._12_8_ = *(undefined8 *)((pbVar2->fill).data_ + 3);
  local_78.size_ = local_78.prefix.size_ + lVar5;
  local_d8._9_1_ = SUB31(uStack_a0._1_3_,0);
  local_78.f.num_digits = (int)lVar5;
  local_78.fill = uStack_a0._4_4_;
  local_d8._8_8_ = uStack_a0;
  if ((local_d8._9_1_ & 0xf) == 4) {
    uVar6 = local_d8._0_8_ & 0xffffffff;
    local_78.padding = 0;
    if (local_78.size_ <= uVar6) {
      local_78.padding = uVar6 - local_78.size_;
      local_78.size_ = uVar6;
    }
  }
  else {
    uVar7 = local_78.f.num_digits;
    if (local_78.f.num_digits < (int)local_d8.precision) {
      uVar7 = local_d8.precision;
    }
    if (local_78.f.num_digits < (int)local_d8.precision) {
      local_78.fill = L'0';
      local_78.size_ = (uint)local_d8.precision + local_78.prefix.size_;
    }
    local_78.padding = (ulong)(uVar7 - local_78.f.num_digits);
    if ((uStack_a0 & 0xf00) == 0) {
      local_d8._8_8_ = uStack_a0 | 0x200;
    }
  }
  local_78.prefix.data_ = this->prefix;
  local_a8 = local_d8._0_8_;
  local_98 = (wchar_t  [2])local_d8.fill.data_._4_8_;
  awStack_90 = (wchar_t  [2])local_d8.fill.data_._12_8_;
  local_88 = local_d8.fill.data_[5];
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_d8,&local_78);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }